

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::jacobiEigenSolver<double>
               (Matrix33<double> *A,Vec3<double> *S,Matrix33<double> *V,double tol)

{
  int i;
  long lVar1;
  double *pdVar2;
  uint uVar3;
  bool bVar4;
  BaseType_conflict BVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_58 [4];
  double local_38;
  
  V->x[0][0] = 1.0;
  V->x[0][1] = 0.0;
  V->x[0][2] = 0.0;
  V->x[1][0] = 0.0;
  V->x[1][1] = 1.0;
  V->x[2][1] = 0.0;
  V->x[1][2] = 0.0;
  V->x[2][0] = 0.0;
  V->x[2][2] = 1.0;
  pdVar2 = (double *)A;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    (&S->x)[lVar1] = *pdVar2;
    pdVar2 = pdVar2 + 4;
  }
  local_58[3] = tol;
  BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix33<double>>(A);
  local_38 = BVar5 * local_58[3];
  if ((local_38 != 0.0) || (NAN(local_38))) {
    uVar3 = 0;
    while( true ) {
      local_58[2] = 0.0;
      local_58[0] = 0.0;
      local_58[1] = 0.0;
      dVar10 = A->x[0][0];
      dVar9 = A->x[0][1];
      dVar12 = A->x[1][1];
      dVar8 = dVar12 - dVar10;
      dVar6 = ABS(dVar9 + dVar9);
      dVar7 = ABS(dVar8) * local_58[3];
      if (dVar6 <= dVar7) {
        A->x[0][1] = 0.0;
      }
      else {
        dVar8 = dVar8 / (dVar9 + dVar9);
        dVar8 = *(double *)(&DAT_0014a100 + (ulong)(dVar8 < 0.0) * 8) /
                (SQRT(dVar8 * dVar8 + 1.0) + ABS(dVar8));
        dVar11 = 1.0 / SQRT(dVar8 * dVar8 + 1.0);
        dVar9 = dVar9 * dVar8;
        dVar8 = dVar8 * dVar11;
        local_58[0] = 0.0 - dVar9;
        local_58[1] = dVar9 + 0.0;
        A->x[0][0] = dVar10 - dVar9;
        A->x[1][1] = dVar12 + dVar9;
        A->x[0][1] = 0.0;
        dVar10 = dVar8 / (dVar11 + 1.0);
        dVar9 = A->x[0][2];
        dVar12 = A->x[1][2];
        A->x[0][2] = dVar9 - (dVar10 * dVar9 + dVar12) * dVar8;
        A->x[1][2] = (dVar9 - dVar10 * dVar12) * dVar8 + dVar12;
        for (lVar1 = 0; lVar1 != 0x48; lVar1 = lVar1 + 0x18) {
          pdVar2 = (double *)((long)V->x[0] + lVar1);
          dVar9 = *pdVar2;
          dVar12 = pdVar2[1];
          pdVar2 = (double *)((long)V->x[0] + lVar1);
          *pdVar2 = (dVar10 * dVar9 + dVar12) * -dVar8 + dVar9;
          pdVar2[1] = (-dVar10 * dVar12 + dVar9) * dVar8 + dVar12;
        }
        dVar10 = A->x[0][0];
      }
      dVar9 = A->x[0][2];
      dVar12 = A->x[2][2];
      dVar8 = ABS(dVar9 + dVar9);
      dVar11 = ABS(dVar12 - dVar10) * local_58[3];
      if (dVar8 <= dVar11) {
        A->x[0][2] = 0.0;
      }
      else {
        dVar13 = (dVar12 - dVar10) / (dVar9 + dVar9);
        dVar13 = *(double *)(&DAT_0014a100 + (ulong)(dVar13 < 0.0) * 8) /
                 (SQRT(dVar13 * dVar13 + 1.0) + ABS(dVar13));
        dVar14 = 1.0 / SQRT(dVar13 * dVar13 + 1.0);
        dVar9 = dVar9 * dVar13;
        dVar13 = dVar13 * dVar14;
        dVar14 = dVar13 / (dVar14 + 1.0);
        local_58[0] = local_58[0] - dVar9;
        local_58[2] = dVar9 + 0.0;
        A->x[0][0] = dVar10 - dVar9;
        A->x[2][2] = dVar12 + dVar9;
        A->x[0][2] = 0.0;
        dVar9 = A->x[0][1];
        dVar12 = A->x[1][2];
        A->x[0][1] = dVar9 - (dVar14 * dVar9 + dVar12) * dVar13;
        A->x[1][2] = (dVar9 - dVar14 * dVar12) * dVar13 + dVar12;
        for (lVar1 = 0x10; lVar1 != 0x58; lVar1 = lVar1 + 0x18) {
          dVar9 = *(double *)((long)(V->x + -1) + 8 + lVar1);
          dVar12 = *(double *)((long)V->x[0] + lVar1);
          *(double *)((long)(V->x + -1) + 8 + lVar1) = (dVar14 * dVar9 + dVar12) * -dVar13 + dVar9;
          *(double *)((long)V->x[0] + lVar1) = (-dVar14 * dVar12 + dVar9) * dVar13 + dVar12;
        }
        dVar12 = A->x[2][2];
      }
      dVar9 = A->x[1][1];
      dVar10 = A->x[1][2];
      dVar15 = dVar12 - dVar9;
      dVar13 = ABS(dVar10 + dVar10);
      dVar14 = ABS(dVar15) * local_58[3];
      if (dVar13 <= dVar14) {
        A->x[1][2] = 0.0;
      }
      else {
        dVar15 = dVar15 / (dVar10 + dVar10);
        dVar15 = *(double *)(&DAT_0014a100 + (ulong)(dVar15 < 0.0) * 8) /
                 (SQRT(dVar15 * dVar15 + 1.0) + ABS(dVar15));
        dVar16 = 1.0 / SQRT(dVar15 * dVar15 + 1.0);
        dVar10 = dVar10 * dVar15;
        dVar15 = dVar15 * dVar16;
        dVar16 = dVar15 / (dVar16 + 1.0);
        local_58[1] = local_58[1] - dVar10;
        local_58[2] = local_58[2] + dVar10;
        A->x[1][1] = dVar9 - dVar10;
        A->x[2][2] = dVar12 + dVar10;
        A->x[1][2] = 0.0;
        dVar9 = A->x[0][1];
        dVar12 = A->x[0][2];
        A->x[0][1] = (dVar16 * dVar9 + dVar12) * -dVar15 + dVar9;
        A->x[0][2] = (-dVar16 * dVar12 + dVar9) * dVar15 + dVar12;
        for (lVar1 = 8; lVar1 != 0x50; lVar1 = lVar1 + 0x18) {
          pdVar2 = (double *)((long)V->x[0] + lVar1);
          dVar9 = *pdVar2;
          dVar12 = pdVar2[1];
          pdVar2 = (double *)((long)V->x[0] + lVar1);
          *pdVar2 = (dVar16 * dVar9 + dVar12) * -dVar15 + dVar9;
          pdVar2[1] = (-dVar16 * dVar12 + dVar9) * dVar15 + dVar12;
        }
      }
      pdVar2 = (double *)A;
      for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
        dVar9 = local_58[lVar1] + (&S->x)[lVar1];
        (&S->x)[lVar1] = dVar9;
        *pdVar2 = dVar9;
        pdVar2 = pdVar2 + 4;
      }
      if ((dVar8 <= dVar11 && dVar6 <= dVar7) && dVar13 <= dVar14) break;
      BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix33<double>>(A);
      if (BVar5 <= local_38) {
        return;
      }
      bVar4 = 0x12 < uVar3;
      uVar3 = uVar3 + 1;
      if (bVar4) {
        return;
      }
    }
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix33<T>& A, Vec3<T>& S, Matrix33<T>& V, const T tol)
{
    V.makeIdentity ();
    for (int i = 0; i < 3; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            // Z is for accumulating small changes (h) to diagonal entries
            // of A for one sweep. Adding h's directly to A might cause
            // a cancellation effect when h is relatively very small to
            // the corresponding diagonal entry of A and
            // this will increase numerical errors
            Vec3<T> Z (0, 0, 0);
            ++numIter;
            bool changed = jacobiRotation<0, 1, 2> (A, V, Z, tol);
            changed      = jacobiRotation<0, 2, 1> (A, V, Z, tol) || changed;
            changed      = jacobiRotation<1, 2, 0> (A, V, Z, tol) || changed;
            // One sweep passed. Add accumulated changes (Z) to singular values (S)
            // Update diagonal elements of A for better accuracy as well.
            for (int i = 0; i < 3; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}